

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

Vec_Int_t * Gia_ManFindMapping(Gia_Man_t *p,Vec_Int_t *vFadds,Vec_Int_t *vMap,Vec_Wec_t *vChains)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *__s;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  
  iVar1 = p->nObjs;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  pVVar6->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar5 << 2);
  }
  pVVar6->pArray = __s;
  pVVar6->nSize = iVar1;
  memset(__s,0xff,(long)iVar1 << 2);
  iVar5 = vChains->nSize;
  if (0 < (long)iVar5) {
    pVVar3 = vChains->pArray;
    lVar7 = 0;
    do {
      if (pVVar3[lVar7].nSize < 1) {
        __assert_fail("Vec_IntSize(vChain) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x23c,
                      "Vec_Int_t *Gia_ManFindMapping(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                     );
      }
      piVar4 = pVVar3[lVar7].pArray;
      lVar8 = 0;
      do {
        uVar2 = piVar4[lVar8];
        if (((int)uVar2 < 0) || (uVar9 = uVar2 * 5 + 3, vFadds->nSize <= (int)uVar9))
        goto LAB_005e19c7;
        lVar10 = (long)vFadds->pArray[uVar9];
        if ((lVar10 < 0) || (iVar1 <= vFadds->pArray[uVar9])) goto LAB_005e19c7;
        if (__s[lVar10] != -1) {
          __assert_fail("Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+3)) == -1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                        ,0x240,
                        "Vec_Int_t *Gia_ManFindMapping(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                       );
        }
        __s[lVar10] = (int)lVar7;
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar3[lVar7].nSize);
      if (vFadds->nSize <= (int)(uVar2 * 5 + 4)) {
LAB_005e19c7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar8 = (long)vFadds->pArray[(ulong)uVar2 * 5 + 4];
      if ((lVar8 < 0) || (iVar1 <= vFadds->pArray[(ulong)uVar2 * 5 + 4])) goto LAB_005e19c7;
      if (__s[lVar8] != -1) {
        __assert_fail("Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+4)) == -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x244,
                      "Vec_Int_t *Gia_ManFindMapping(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                     );
      }
      __s[lVar8] = (int)lVar7;
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar5);
  }
  return pVVar6;
}

Assistant:

Vec_Int_t * Gia_ManFindMapping( Gia_Man_t * p, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains )
{
    Vec_Int_t * vChain;
    int i, k, iFadd = -1;
    Vec_Int_t * vMap2Chain = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_WecForEachLevel( vChains, vChain, i )
    {
        assert( Vec_IntSize(vChain) > 0 );
        Vec_IntForEachEntry( vChain, iFadd, k )
        {
            //printf( "Chain %d: setting SUM %d (obj %d)\n", i, k, Vec_IntEntry(vFadds, 5*iFadd+3) );
            assert( Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+3)) == -1 );
            Vec_IntWriteEntry( vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+3), i );
        }
        //printf( "Chain %d: setting CARRY (obj %d)\n", i, Vec_IntEntry(vFadds, 5*iFadd+4) );
        assert( Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+4)) == -1 );
        Vec_IntWriteEntry( vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+4), i );
    }
    return vMap2Chain;
}